

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_hc3_find(lzma_mf *mf,lzma_match *matches)

{
  uint32_t cur_match_00;
  uint32_t pos_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte *cur_00;
  lzma_match *plVar4;
  uint32_t local_54;
  uint local_50;
  uint32_t len_limit;
  uint32_t matches_count;
  uint32_t len_best;
  uint32_t cur_match;
  uint32_t delta2;
  uint32_t hash_2_value;
  uint32_t hash_value;
  uint32_t temp;
  uint32_t pos;
  uint8_t *cur;
  lzma_match *matches_local;
  lzma_mf *mf_local;
  
  len_limit = 2;
  local_50 = 0;
  local_54 = mf_avail(mf);
  if (local_54 < mf->nice_len) {
    if (local_54 < 3) {
      if (mf->action != LZMA_RUN) {
        move_pending(mf);
        return 0;
      }
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x143,"uint32_t lzma_mf_hc3_find(lzma_mf *, lzma_match *)");
    }
  }
  else {
    local_54 = mf->nice_len;
  }
  cur_00 = mf_ptr(mf);
  pos_00 = mf->read_pos + mf->offset;
  uVar1 = lzma_crc32_table[0][*cur_00] ^ (uint)cur_00[1];
  uVar2 = uVar1 & 0x3ff;
  uVar1 = (uVar1 ^ (uint)cur_00[2] << 8) & mf->hash_mask;
  uVar3 = pos_00 - mf->hash[uVar2];
  cur_match_00 = mf->hash[uVar1 + 0x400];
  mf->hash[uVar2] = pos_00;
  mf->hash[uVar1 + 0x400] = pos_00;
  if ((uVar3 < mf->cyclic_size) && (cur_00[-(ulong)uVar3] == *cur_00)) {
    for (; (len_limit != local_54 && (cur_00[(ulong)len_limit - (ulong)uVar3] == cur_00[len_limit]))
        ; len_limit = len_limit + 1) {
    }
    matches->len = len_limit;
    matches->dist = uVar3 - 1;
    local_50 = 1;
    if (len_limit == local_54) {
      mf->son[mf->cyclic_pos] = cur_match_00;
      move_pos(mf);
      return 1;
    }
  }
  plVar4 = hc_find_func(local_54,pos_00,cur_00,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                        mf->cyclic_size,matches + local_50,len_limit);
  move_pos(mf);
  return (uint32_t)((long)plVar4 - (long)matches >> 3);
}

Assistant:

extern uint32_t
lzma_mf_hc3_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value; /* hash_3_calc */
	uint32_t delta2, cur_match;
	uint32_t len_best = 2;
	uint32_t matches_count = 0;

	header_find(false, 3);

	hash_3_calc();

	delta2 = pos - mf->hash[hash_2_value];
	cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[0].len = len_best;
		matches[0].dist = delta2 - 1;
		matches_count = 1;

		if (len_best == len_limit) {
			hc_skip();
			return 1; // matches_count
		}
	}

	hc_find(len_best);
}